

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void __thiscall SchemaAdapter::SchemaAdapter(SchemaAdapter *this,PrefsPtr *prefs,SchemaPtr *schema)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_class_8_1_8991fb9c local_20;
  
  cursespp::ScrollAdapterBase::ScrollAdapterBase(&this->super_ScrollAdapterBase);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)&PTR__SchemaAdapter_001a6af8;
  *(undefined8 *)&(this->onChanged).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->onChanged).super__Function_base._M_functor + 8) = 0;
  (this->onChanged).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->onChanged)._M_invoker = (_Invoker_type)0x0;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->schema).super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (schema->super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->schema).super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->changed = false;
  local_20.this = this;
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)&this->onChanged,&local_20);
  return;
}

Assistant:

SchemaAdapter(PrefsPtr prefs, SchemaPtr schema): prefs(prefs), schema(schema) {
            onChanged = [this](std::string value) {
                this->changed = true;
            };
        }